

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void av1_calc_mb_wiener_var_mt
               (AV1_COMP *cpi,int num_workers,double *sum_rec_distortion,double *sum_est_rate)

{
  AV1_PRIMARY *pAVar1;
  ThreadData_conflict *__dest;
  AVxWorker *pAVar2;
  ThreadData_conflict *pTVar3;
  ulong uVar4;
  int iVar5;
  EncWorkerData *pEVar6;
  EncWorkerData *pEVar7;
  AVxWorkerInterface *pAVar8;
  AVxWorker *pAVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  uVar4 = (ulong)(uint)num_workers;
  pAVar1 = cpi->ppi;
  iVar11 = (cpi->common).mi_params.mi_rows;
  row_mt_sync_mem_alloc(&pAVar1->intra_row_mt_sync,&cpi->common,iVar11);
  (pAVar1->intra_row_mt_sync).intrabc_extra_top_right_sb_delay = 0;
  (pAVar1->intra_row_mt_sync).num_threads_working = num_workers;
  (pAVar1->intra_row_mt_sync).next_mi_row = 0;
  memset((pAVar1->intra_row_mt_sync).num_finished_cols,0xff,(long)iVar11 << 2);
  (cpi->mt_info).enc_row_mt.mb_wiener_mt_exit = false;
  if (num_workers < 1) {
    aom_get_worker_interface();
  }
  else {
    pTVar3 = &cpi->td;
    lVar10 = uVar4 - 1;
    pAVar9 = (cpi->mt_info).workers;
    pEVar6 = (cpi->mt_info).tile_thr_data;
    pEVar7 = pEVar6 + lVar10;
    pAVar9[lVar10].hook = cal_mb_wiener_var_hook;
    pAVar9[lVar10].data1 = pEVar7;
    pAVar9[lVar10].data2 = (void *)0x0;
    pEVar6[lVar10].thread_id = (int)lVar10;
    pEVar6[lVar10].start = 0;
    pEVar6[lVar10].cpi = cpi;
    if (lVar10 != 0) {
      lVar13 = uVar4 * -0x1d0 + 0x1d0;
      lVar15 = uVar4 * 0x1d0 + -0x3a0;
      lVar16 = uVar4 * 0x38 + -0x48;
      uVar12 = uVar4;
      lVar14 = lVar10;
      do {
        __dest = pEVar7->original_td;
        pEVar7->td = __dest;
        if (__dest != pTVar3) {
          memcpy(__dest,pTVar3,0x256b0);
          av1_alloc_mb_wiener_var_pred_buf(&cpi->common,pEVar7->td);
          pAVar9 = (cpi->mt_info).workers;
          pEVar6 = (cpi->mt_info).tile_thr_data;
        }
        lVar14 = lVar14 + -1;
        pEVar7 = pEVar6 + lVar14;
        *(code **)((long)pAVar9 + lVar16 + -0x10) = cal_mb_wiener_var_hook;
        *(char **)((long)pAVar9 + lVar16 + -8) = (pEVar6->error_info).detail + lVar15 + -0x20;
        *(undefined8 *)((long)&pAVar9->impl_ + lVar16) = 0;
        *(int *)((long)&pEVar6->thread_id + lVar15) = (int)uVar12 + -2;
        *(undefined4 *)((long)&pEVar6->start + lVar15) = 0;
        *(AV1_COMP **)((pEVar6->error_info).detail + lVar15 + -0x20) = cpi;
        uVar12 = uVar12 - 1;
        lVar13 = lVar13 + 0x1d0;
        lVar15 = lVar15 + -0x1d0;
        lVar16 = lVar16 + -0x38;
      } while (uVar12 != 1);
      pEVar7 = (EncWorkerData *)((long)pEVar6 - lVar13);
    }
    pEVar7->td = pTVar3;
    pAVar8 = aom_get_worker_interface();
    pAVar2 = (cpi->mt_info).workers;
    pAVar9 = pAVar2 + lVar10;
    pAVar2[lVar10].had_error = 0;
    if (lVar10 != 0) {
      lVar14 = uVar4 * -0x38 + 0x38;
      lVar13 = uVar4 * 0x38 + -0x40;
      do {
        (*pAVar8->launch)(pAVar9);
        lVar10 = lVar10 + -1;
        pAVar2 = (cpi->mt_info).workers;
        pAVar9 = pAVar2 + lVar10;
        *(undefined4 *)((long)&pAVar2->impl_ + lVar13) = 0;
        lVar14 = lVar14 + 0x38;
        lVar13 = lVar13 + -0x38;
      } while (lVar10 != 0);
      pAVar9 = (AVxWorker *)((long)pAVar2 - lVar14);
    }
    (*pAVar8->execute)(pAVar9);
  }
  pAVar8 = aom_get_worker_interface();
  pAVar9 = (cpi->mt_info).workers;
  iVar11 = pAVar9->had_error;
  if (iVar11 != 0) {
    memcpy(&local_1d0,(void *)((long)pAVar9->data1 + 0x18),0x1a0);
  }
  if (1 < num_workers) {
    uVar12 = uVar4 + 1;
    lVar10 = uVar4 * 0x38;
    do {
      pAVar2 = (cpi->mt_info).workers;
      iVar5 = (*pAVar8->sync)((AVxWorker *)((long)&pAVar2[-1].impl_ + lVar10));
      if (iVar5 == 0) {
        memcpy(&local_1d0,(void *)(*(long *)((long)&pAVar2[-1].data1 + lVar10) + 0x18),0x1a0);
        iVar11 = 1;
      }
      uVar12 = uVar12 - 1;
      lVar10 = lVar10 + -0x38;
    } while (2 < uVar12);
  }
  if (iVar11 != 0) {
    aom_internal_error_copy((cpi->common).error,&local_1d0);
  }
  *(aom_internal_error_info **)(*(long *)((long)pAVar9->data1 + 8) + 0x2b90) = (cpi->common).error;
  av1_row_mt_sync_mem_dealloc(&cpi->ppi->intra_row_mt_sync);
  if (0 < num_workers) {
    lVar10 = 0;
    do {
      pTVar3 = *(ThreadData_conflict **)
                ((((cpi->mt_info).tile_thr_data)->error_info).detail + lVar10 + -0x18);
      if (pTVar3 != &cpi->td) {
        av1_dealloc_mb_wiener_var_pred_buf(pTVar3);
      }
      lVar10 = lVar10 + 0x1d0;
    } while (uVar4 * 0x1d0 - lVar10 != 0);
  }
  return;
}

Assistant:

void av1_calc_mb_wiener_var_mt(AV1_COMP *cpi, int num_workers,
                               double *sum_rec_distortion,
                               double *sum_est_rate) {
  (void)sum_rec_distortion;
  (void)sum_est_rate;
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadSync *const intra_row_mt_sync =
      &cpi->ppi->intra_row_mt_sync;

  // TODO(chengchen): the memory usage could be improved.
  const int mi_rows = cm->mi_params.mi_rows;
  row_mt_sync_mem_alloc(intra_row_mt_sync, cm, mi_rows);

  intra_row_mt_sync->intrabc_extra_top_right_sb_delay = 0;
  intra_row_mt_sync->num_threads_working = num_workers;
  intra_row_mt_sync->next_mi_row = 0;
  memset(intra_row_mt_sync->num_finished_cols, -1,
         sizeof(*intra_row_mt_sync->num_finished_cols) * mi_rows);
  mt_info->enc_row_mt.mb_wiener_mt_exit = false;

  prepare_wiener_var_workers(cpi, cal_mb_wiener_var_hook, num_workers);
  launch_workers(mt_info, num_workers);
  sync_enc_workers(mt_info, cm, num_workers);
  dealloc_mb_wiener_var_mt_data(cpi, num_workers);
}